

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

Header * readJPG(string *filename)

{
  pointer *ppuVar1;
  iterator iVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  Header *header;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  Header *header_00;
  char *pcVar10;
  byte *pbVar11;
  uint uVar12;
  long lVar13;
  byte last;
  ifstream inFile;
  byte local_249;
  bool *local_248;
  byte local_239;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    header_00 = (Header *)&std::nothrow;
    header = (Header *)operator_new(0x1e70,(nothrow_t *)&std::nothrow);
    if (header == (Header *)0x0) {
      header = (Header *)0x0;
    }
    else {
      header->startOfSelection = '\0';
      header->endOfSelection = '?';
      header->successiveApproximationHigh = '\0';
      header->successiveApproximationLow = '\0';
      (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar13 = 0xd4;
      do {
        memset((void *)((long)header + lVar13 + -0xb4),0,0xb3);
        memset(header->huffmanDCTables[0].offsets + lVar13 + -0x20,0,0x289);
        lVar13 = lVar13 + 0x340;
      } while (lVar13 != 0xdd4);
      lVar13 = 0xd20;
      do {
        lVar3 = lVar13 + -0x20;
        lVar4 = lVar13 + -0x20;
        lVar13 = lVar13 + 0x340;
        memset(header->huffmanDCTables[0].offsets + lVar3,0,0xb3);
        memset((void *)((long)header->huffmanDCTables[0].codes + lVar4),0,0x289);
      } while (lVar13 != 0x1a20);
      header->zeroBased = false;
      lVar13 = 0x1a24;
      do {
        lVar3 = lVar13 + -0x20;
        lVar13 = lVar13 + 0x104;
        header_00 = (Header *)0x0;
        memset(header->huffmanDCTables[0].offsets + lVar3,0,0x101);
      } while (lVar13 != 0x1e34);
      lVar13 = 0x1e36;
      do {
        pbVar11 = header->huffmanDCTables[0].offsets + lVar13 + -0x22;
        pbVar11[0] = '\x01';
        pbVar11[1] = '\x01';
        pbVar11 = header->huffmanDCTables[0].offsets + lVar13 + -0x20;
        pbVar11[0] = '\0';
        pbVar11[1] = '\0';
        pbVar11[2] = '\0';
        pbVar11[3] = '\0';
        lVar13 = lVar13 + 6;
      } while (lVar13 != 0x1e48);
      header->frameType = '\0';
      header->restartInterval = 0;
      header->numComponents = '\0';
      header->height = 0;
      header->width = 0;
      header->valid = true;
      header->mcuHeight = 0;
      header->mcuWidth = 0;
      header->mcuHeightReal = 0;
      header->mcuWidthReal = 0;
      header->horizontalSamplingFactor = '\x01';
      header->verticalSamplingFactor = '\x01';
    }
    if (header != (Header *)0x0) {
      local_249 = std::istream::get();
      cVar5 = std::istream::get();
      if ((cVar5 != -0x28) || (local_249 != 0xff)) {
        header->valid = false;
        std::ifstream::close();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"not JPEG file",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
        goto LAB_00103619;
      }
      local_249 = std::istream::get();
      bVar6 = std::istream::get();
      if (header->valid == true) {
        do {
          if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error File ended premature",0x1a);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
LAB_00103a65:
            local_248 = &header->valid;
            goto LAB_00103c8c;
          }
          if (local_249 != 0xff) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error expected a marker",0x17);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
            goto LAB_00103a65;
          }
          uVar12 = (uint)bVar6;
          if (uVar12 == 0xc0) {
            header->frameType = 0xc0;
            header_00 = header;
            readStartOfFrame((ifstream *)local_238,header);
LAB_00103889:
            local_249 = std::istream::get();
          }
          else {
            if ((bVar6 & 0xf0) == 0xe0) {
              readAPPN((ifstream *)local_238,header_00);
              goto LAB_00103889;
            }
            if (0xdc < bVar6) {
              if (bVar6 == 0xdd) {
                header_00 = header;
                readRestartInterval((ifstream *)local_238,header);
              }
              else {
                if (bVar6 != 0xfe) goto LAB_001038bb;
LAB_00103867:
                readComment((ifstream *)local_238,header_00);
              }
              goto LAB_00103889;
            }
            if (bVar6 == 0xc4) {
              header_00 = header;
              readHuffmanTable((ifstream *)local_238,header);
              goto LAB_00103889;
            }
            if (bVar6 == 0xdb) {
              header_00 = header;
              readQuantizationTable((ifstream *)local_238,header);
              goto LAB_00103889;
            }
            if (bVar6 == 0xda) {
              readStartOfScan((ifstream *)local_238,header);
              break;
            }
LAB_001038bb:
            if (((uVar12 == 0xdf) || ((bVar6 & 0xfd) == 0xdc)) || (uVar12 - 0xf0 < 0xe))
            goto LAB_00103867;
            if (bVar6 < 0xd8) {
              if (bVar6 == 1) goto LAB_00103889;
              if (bVar6 == 0xcc) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Error - Arithmetic Coding code not supported\n",
                           0x2d);
                goto LAB_00103a65;
              }
LAB_00103d7e:
              local_248 = &header->valid;
              if ((bVar6 & 0xf0) == 0xc0) {
                lVar13 = 0x24;
                pcVar10 = "Error - SOF marker not supported: 0x";
              }
              else {
                if ((bVar6 & 0xf8) == 0xd0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Error - RSTN detected before SOS \n",0x22);
                  goto LAB_00103c8c;
                }
                lVar13 = 0x19;
                pcVar10 = "Error - Unknow marker 0x:";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar10,lVar13);
              *(uint *)(std::ofstream::~ofstream + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::ofstream::~ofstream + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
                   8;
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::endl<char,std::char_traits<char>>(poVar8);
              goto LAB_00103c8c;
            }
            if (bVar6 != 0xff) {
              if (bVar6 == 0xd8) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Error -Embedded JPGs not supported\n",0x23);
              }
              else {
                if (bVar6 != 0xd9) goto LAB_00103d7e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Error - EOI detected before SOS\n",0x20);
              }
              goto LAB_00103a65;
            }
          }
          bVar6 = std::istream::get();
        } while (header->valid != false);
      }
      local_248 = &header->valid;
      if (header->valid == true) {
        bVar6 = std::istream::get();
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
          do {
            local_249 = bVar6;
            bVar6 = std::istream::get();
            if (local_249 == 0xff) {
              if (bVar6 == 0) {
                iVar2._M_current =
                     (header->huffmanData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (header->huffmanData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                             &header->huffmanData,iVar2,&local_249);
                }
                else {
                  *iVar2._M_current = 0xff;
                  ppuVar1 = &(header->huffmanData).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppuVar1 = *ppuVar1 + 1;
                }
              }
              else {
                if (bVar6 == 0xd9) goto LAB_00103bb8;
                if ((bVar6 & 0xf8) != 0xd0) {
                  if (bVar6 == 0xff) goto LAB_00103b59;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "Error Invalid marker during compressed data scan: 0x",0x34);
                  *(uint *)(std::ofstream::~ofstream + *(long *)(std::cout + -0x18)) =
                       *(uint *)(std::ofstream::~ofstream + *(long *)(std::cout + -0x18)) &
                       0xffffffb5 | 8;
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 |
                       2;
                  std::endl<char,std::char_traits<char>>(poVar8);
                  goto LAB_00103c8c;
                }
              }
              bVar6 = std::istream::get();
            }
            else {
              iVar2._M_current =
                   (header->huffmanData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (header->huffmanData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                           &header->huffmanData,iVar2,&local_249);
              }
              else {
                *iVar2._M_current = local_249;
                ppuVar1 = &(header->huffmanData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
            }
LAB_00103b59:
          } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error File ended premature",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
LAB_00103c8c:
        *local_248 = false;
      }
      else {
LAB_00103bb8:
        uVar7 = (ulong)header->numComponents;
        if ((header->numComponents | 2) != 3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error - ",8);
          local_239 = header->numComponents;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_239,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"required color compoenent 1 or 3 \n",0x22);
          goto LAB_00103c8c;
        }
        pbVar11 = &header->colorComponent[0].quantizationTableID;
        pcVar10 = "Error - using uninitialized quantization talbe\n";
        do {
          uVar9 = (ulong)*pbVar11;
          if ((&header->quantizationTables[0].set)[(ulong)*pbVar11 * 0x100 + uVar9 * 4] == false) {
            lVar13 = 0x2f;
LAB_00103cb2:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar13)
            ;
            *local_248 = false;
            std::ifstream::close();
            goto LAB_00103619;
          }
          lVar13 = 0x2d;
          if (header->huffmanACTables[uVar9].set == false) {
            pcVar10 = "Error - using uninitialized Huffman AC talbe\n";
            goto LAB_00103cb2;
          }
          if (header->huffmanDCTables[uVar9].set == false) {
            pcVar10 = "Error - using uninitialized Huffman DC talbe\n";
            goto LAB_00103cb2;
          }
          pbVar11 = pbVar11 + 6;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      std::ifstream::close();
      goto LAB_00103619;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Memory error",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    std::ifstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error opening file",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  header = (Header *)0x0;
LAB_00103619:
  std::ifstream::~ifstream(local_238);
  return header;
}

Assistant:

Header* readJPG(const std::string filename) {
	std::ifstream inFile = std::ifstream(filename, std::ios::in | std::ios::binary);
	if (!inFile) {
		std::cout << "Error opening file" <<std::endl;
		return nullptr;
	}

	Header* header = new(std::nothrow) Header;
	if (header == nullptr) {
		std::cout << "Memory error" << std::endl;
		inFile.close();
		return nullptr;
	}

	byte last = inFile.get();
	byte current = inFile.get();

	if (last != 0xff || current != SOI) {
		header->valid = false;
		inFile.close();
		std::cout << "not JPEG file" << std::endl;
		return header;
	}

	last = inFile.get();
	current = inFile.get();
	while (header->valid) {
		if (!inFile) {
			std::cout << "Error File ended premature" << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}

		if (last != 0xff) {
			std::cout << "Error expected a marker" << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}

		// 读取frame类型 只支持baseline
		if (current == SOF0) {
			header->frameType = SOF0;
			readStartOfFrame(inFile, header);
		}  
		/*
			APPn的处理
			An APPn marker may appear anywhere within a JPEG file.
			By convention, applications that create APPn markers store their name at the start of the marker to prevent conflicts with other applications.
		*/
		else if (current >= APP0 && current <= APP15) {
			readAPPN(inFile, header);
		}
		/*
			DQT的处理
			An DQT marker may appear anywhere within a JPEG file.
			one restriction is if a scan requires a quantization table
			it must have been defined in a previous DQT marker
		*/
		else if (current == DQT) {
			readQuantizationTable(inFile, header);
		} 
		/*
			DRI的处理
			Define Restart Interval marker specifies the number of MCUs 
			between restart markers within the compressed data.
			A DRI marker may appear anywhere in the file to define or redefine the restart interval.
			A DRI marker must appear somwhere in the file for a compressed data segment to include restart markers
			
		*/
		else if (current == DRI) {
			readRestartInterval(inFile, header);
		}
		/*
			DHT处理，哈夫曼表
		*/
		else if (current == DHT) {
			readHuffmanTable(inFile, header);
			
		}
		/*
			Start of Scan

		*/
		else if (current == SOS) {
			readStartOfScan(inFile, header);
			break;
		} //skip
		else if (current == COM){
			readComment(inFile, header);
		} //unnecessary, skip
		else if ((current >= JPG0 && current <= JPG13) || current == DNL || current == DHP || current == EXP) {
			readComment(inFile, header);
		}
		else if (current == TEM) {
			//TEM has no size
		}
		/*
			FF may be used as a fill character before the start of any marker
			just ignore
		*/
		else if (current == 0xFF) {
			current = inFile.get();
			continue;
		} 
		else if (current == SOI) {
			std::cout << "Error -Embedded JPGs not supported\n";
			header->valid = false;
			inFile.close();
			return header;
		} 
		else if (current == EOI) {
			std::cout << "Error - EOI detected before SOS\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current == DAC) {
			std::cout << "Error - Arithmetic Coding code not supported\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current >= SOF0 && current <= SOF15) {
			std::cout << "Error - SOF marker not supported: 0x" << std::hex << (uint)current << std::dec << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current >= RST0 && current <= RST7) {
			std::cout << "Error - RSTN detected before SOS \n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else {
			std::cout << "Error - Unknow marker 0x:" << std::hex << (uint)current << std::dec << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}
		last = inFile.get();
		current = inFile.get();
	}

	/*
		after SOS
		压缩数据的处理
		FF00代表00
		FFFF 多个FF的话，只当做一个FF
		会遇到RST, DNL, EOI
	*/
	if (header->valid) {
		current = inFile.get();
		//read compressed image data
		while (true) {
			if (!inFile) {
				std::cout << "Error File ended premature" << std::endl;
				header->valid = false;
				inFile.close();
				return header;
			}
			last = current;
			current = inFile.get();
			//marker or FF
			if (last == 0xFF) {
				//end of image
				if (current == EOI) {
					break;
				} 
				// 0xFF00 means FF
				else if (current == 0x00) {
					header->huffmanData.push_back(last);
					current = inFile.get();
				}
				//restart marker
				else if (current >= RST0 && current <= RST7) {
					current = inFile.get();
				}
				//ignore multiple 0xFF
				else if (current == 0xFF) {
					// do nothing, one FF will be ignored.
					continue;
				}
				else {
					std::cout << "Error Invalid marker during compressed data scan: 0x" << std::hex << (uint)current << std::dec << std::endl;
					header->valid = false;
					inFile.close();
					return header;
				}
			}
			else {
				header->huffmanData.push_back(last);
			}
		}
	}

	//invalid header info
	if (header->numComponents != 1 && header->numComponents != 3) {
		std::cout << "Error - " << header->numComponents << "required color compoenent 1 or 3 \n";
		header->valid = false;
		inFile.close();
		return header;
	}

	for (uint i = 0; i < header->numComponents; i++) {
		if (header->quantizationTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized quantization talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		if (header->huffmanACTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized Huffman AC talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		if (header->huffmanDCTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized Huffman DC talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
	}
	inFile.close();
	return header;
}